

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

int uECC_sign_with_k(uint8_t *private_key,uint8_t *message_hash,uint hash_size,uECC_word_t *k,
                    uint8_t *signature,uECC_Curve curve)

{
  uECC_word_t *left;
  short sVar1;
  cmpresult_t cVar2;
  bitcount_t bVar3;
  int iVar4;
  uint uVar5;
  uECC_word_t bits;
  long lVar6;
  uECC_word_t uVar7;
  ulong uVar8;
  int iVar9;
  wordcount_t i;
  long lVar10;
  long lVar11;
  char num_words;
  uECC_word_t tmp [4];
  uECC_word_t *k2 [2];
  uECC_word_t s [4];
  uECC_word_t p [8];
  uECC_word_t local_d8 [4];
  uint8_t *local_b8;
  uint8_t *local_b0;
  uECC_word_t *local_a8 [2];
  uECC_word_t local_98 [4];
  uECC_word_t local_78 [9];
  
  local_a8[0] = local_d8;
  local_a8[1] = local_98;
  lVar11 = (long)curve->num_words;
  sVar1 = curve->num_n_bits;
  iVar4 = sVar1 + 0x3f;
  iVar9 = sVar1 + 0x7e;
  if (-1 < iVar4) {
    iVar9 = iVar4;
  }
  if (lVar11 < 1) {
LAB_00104203:
    iVar4 = 0;
  }
  else {
    lVar6 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 | k[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar11 != lVar6);
    if (uVar8 == 0) {
      return 0;
    }
    left = curve->n;
    num_words = (char)(iVar9 >> 6);
    local_b8 = private_key;
    local_b0 = message_hash;
    cVar2 = uECC_vli_cmp(left,k,num_words);
    if (cVar2 != '\x01') {
      return 0;
    }
    uVar7 = regularize_k(k,local_d8,local_98,curve);
    lVar6 = 0;
    EccPoint_mult(local_78,curve->G,local_a8[uVar7 ^ 1],(uECC_word_t *)0x0,sVar1 + 1,curve);
    uVar8 = 0;
    do {
      uVar8 = uVar8 | local_78[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar11 != lVar6);
    if (uVar8 == 0) {
      return 0;
    }
    if (g_rng_function == (uECC_RNG_Function)0x0) {
      if ('\0' < num_words) {
        memset(local_d8,0,(ulong)((iVar9 >> 6 & 0x7fU) << 3));
      }
      local_d8[0] = 1;
    }
    else {
      iVar4 = uECC_generate_random_int(local_d8,left,num_words);
      if (iVar4 == 0) goto LAB_00104203;
    }
    uECC_vli_modMult(k,k,local_d8,left,num_words);
    uECC_vli_modInv(k,k,left,num_words);
    uECC_vli_modMult(k,k,local_d8,left,num_words);
    uVar5 = (uint)curve->num_bytes;
    if ('\0' < curve->num_bytes) {
      lVar6 = (long)(int)uVar5;
      iVar4 = uVar5 * 8;
      lVar10 = 0;
      do {
        iVar4 = iVar4 + -8;
        uVar5 = uVar5 - 1;
        signature[lVar10] =
             (uint8_t)(*(ulong *)((long)local_78 + (ulong)(uVar5 & 0xfffffff8)) >>
                      ((byte)iVar4 & 0x38));
        lVar10 = lVar10 + 1;
      } while (lVar6 != lVar10);
    }
    iVar4 = curve->num_n_bits + 7;
    iVar9 = curve->num_n_bits + 0xe;
    if (-1 < iVar4) {
      iVar9 = iVar4;
    }
    uECC_vli_bytesToNative(local_d8,local_b8,iVar9 >> 3);
    local_98[(long)num_words + -1] = 0;
    memcpy(local_98,local_78,lVar11 << 3);
    uECC_vli_modMult(local_98,local_d8,local_98,left,num_words);
    bits2int(local_d8,local_b0,hash_size,curve);
    uECC_vli_modAdd(local_98,local_d8,local_98,left,num_words);
    uECC_vli_modMult(local_98,local_98,k,left,num_words);
    bVar3 = uECC_vli_numBits(local_98,num_words);
    uVar5 = (uint)curve->num_bytes;
    iVar9 = uVar5 * 8;
    iVar4 = 0;
    if (bVar3 <= iVar9) {
      lVar11 = (long)(int)uVar5;
      iVar4 = 1;
      if ('\0' < curve->num_bytes) {
        lVar6 = 0;
        do {
          uVar5 = uVar5 - 1;
          iVar9 = iVar9 + -8;
          signature[lVar6 + lVar11] =
               (uint8_t)(*(ulong *)((long)local_98 + (ulong)(uVar5 & 0xfffffff8)) >>
                        ((byte)iVar9 & 0x38));
          lVar6 = lVar6 + 1;
        } while (lVar11 != lVar6);
      }
    }
  }
  return iVar4;
}

Assistant:

static int uECC_sign_with_k(const uint8_t *private_key,
                            const uint8_t *message_hash,
                            unsigned hash_size,
                            uECC_word_t *k,
                            uint8_t *signature,
                            uECC_Curve curve) {

    uECC_word_t tmp[uECC_MAX_WORDS];
    uECC_word_t s[uECC_MAX_WORDS];
    uECC_word_t *k2[2] = {tmp, s};
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *p = (uECC_word_t *)signature;
#else
    uECC_word_t p[uECC_MAX_WORDS * 2];
#endif
    uECC_word_t carry;
    wordcount_t num_words = curve->num_words;
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    bitcount_t num_n_bits = curve->num_n_bits;

    /* Make sure 0 < k < curve_n */
    if (uECC_vli_isZero(k, num_words) || uECC_vli_cmp(curve->n, k, num_n_words) != 1) {
        return 0;
    }

    carry = regularize_k(k, tmp, s, curve);
    EccPoint_mult(p, curve->G, k2[!carry], 0, num_n_bits + 1, curve);
    if (uECC_vli_isZero(p, num_words)) {
        return 0;
    }

    /* If an RNG function was specified, get a random number
       to prevent side channel analysis of k. */
    if (!g_rng_function) {
        uECC_vli_clear(tmp, num_n_words);
        tmp[0] = 1;
    } else if (!uECC_generate_random_int(tmp, curve->n, num_n_words)) {
        return 0;
    }

    /* Prevent side channel analysis of uECC_vli_modInv() to determine
       bits of k / the private key by premultiplying by a random number */
    uECC_vli_modMult(k, k, tmp, curve->n, num_n_words); /* k' = rand * k */
    uECC_vli_modInv(k, k, curve->n, num_n_words);       /* k = 1 / k' */
    uECC_vli_modMult(k, k, tmp, curve->n, num_n_words); /* k = 1 / k */

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_nativeToBytes(signature, curve->num_bytes, p); /* store r */
#endif

#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) tmp, private_key, BITS_TO_BYTES(curve->num_n_bits));
#else
    uECC_vli_bytesToNative(tmp, private_key, BITS_TO_BYTES(curve->num_n_bits)); /* tmp = d */
#endif

    s[num_n_words - 1] = 0;
    uECC_vli_set(s, p, num_words);
    uECC_vli_modMult(s, tmp, s, curve->n, num_n_words); /* s = r*d */

    bits2int(tmp, message_hash, hash_size, curve);
    uECC_vli_modAdd(s, tmp, s, curve->n, num_n_words); /* s = e + r*d */
    uECC_vli_modMult(s, s, k, curve->n, num_n_words);  /* s = (e + r*d) / k */
    if (uECC_vli_numBits(s, num_n_words) > (bitcount_t)curve->num_bytes * 8) {
        return 0;
    }
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) signature + curve->num_bytes, (uint8_t *) s, curve->num_bytes);
#else
    uECC_vli_nativeToBytes(signature + curve->num_bytes, curve->num_bytes, s);
#endif    
    return 1;
}